

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O2

void testWriteBaseHeader(string *tempdir)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  exr_chunk_info_t *func;
  char *pcVar6;
  char *pcVar7;
  exr_context_t outf;
  int partidx;
  float dlev;
  uint32_t tysize;
  uint32_t txsize;
  exr_storage_t storage;
  exr_tile_round_mode_t rmode;
  exr_tile_level_mode_t lmode;
  int zlev;
  uint32_t verflags;
  char *partname;
  string outfn;
  uint64_t cto;
  exr_attr_v2f_t swc;
  exr_attr_box2i_t dispw;
  exr_attr_box2i_t dataw;
  undefined1 local_c0 [16];
  uint64_t local_b0;
  uint64_t uStack_a8;
  uint64_t local_a0;
  uint64_t uStack_98;
  uint64_t local_90;
  uint64_t uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  exr_chunk_info_t cinfo;
  
  std::operator+(&outfn,tempdir,"testattr.exr");
  func = (exr_chunk_info_t *)local_c0;
  local_70 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_60 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_c0._0_8_ = 0x68;
  uStack_68 = 0xbf800000fffffffe;
  local_c0._8_8_ = err_cb;
  uVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
  if (uVar1 == 0) {
    uVar1 = exr_get_count(outf,&partidx);
    if (uVar1 != 0) goto LAB_0013936a;
    pcVar6 = "partidx == 0";
    if (partidx != 0) goto LAB_001393cb;
    iVar2 = exr_get_count(0,&partidx);
    if (iVar2 != 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_count (__null, &partidx)",(char *)0x125,0x320d59,(char *)func);
LAB_00139475:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_count (outf, __null)",(char *)0x127,0x320d59,(char *)func);
LAB_00139515:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_add_part (__null, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x12b,
                     0x320d59,(char *)func);
LAB_001395b5:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      pcVar6 = (char *)std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<((ostream *)pcVar6,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x12d,
                     0x320d59,(char *)func);
LAB_00139616:
      pcVar7 = (char *)0x12e;
      goto LAB_0013968a;
    }
    iVar2 = exr_get_count(outf,0);
    if (iVar2 != 3) goto LAB_00139475;
    func = (exr_chunk_info_t *)&partidx;
    iVar2 = exr_add_part(0,"beauty",1);
    if (iVar2 != 2) goto LAB_00139515;
    func = (exr_chunk_info_t *)&partidx;
    iVar2 = exr_add_part(outf,"beauty",1);
    if (iVar2 != 0) goto LAB_001395b5;
    if (partidx != 0) goto LAB_00139616;
    iVar2 = exr_get_count(outf,&partidx);
    if (iVar2 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_count (outf, &partidx)",(char *)0x12f,0x320d59,(char *)func);
LAB_0013967e:
      pcVar7 = (char *)0x130;
      pcVar6 = "partidx == 1";
      goto LAB_0013968a;
    }
    if (partidx != 1) goto LAB_0013967e;
    partidx = 0;
    func = &cinfo;
    uVar1 = exr_read_scanline_chunk_info(outf,0,0x2a);
    pcVar6 = (char *)(ulong)uVar1;
    if (uVar1 != 7) goto LAB_00139699;
    uVar1 = exr_get_name(0,partidx,&partname);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 2) goto LAB_00139739;
    uVar1 = exr_get_name(outf,partidx + -1,&partname);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_001397d9;
    uVar1 = exr_get_name(outf,partidx + 1,&partname);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_00139879;
    uVar1 = exr_get_name(outf,partidx,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_00139919;
    uVar1 = exr_get_name(outf,partidx,&partname);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_001399b9;
    iVar3 = strcmp(partname,"beauty");
    iVar2 = 0;
    if (iVar3 != 0) goto LAB_00139a1a;
    iVar2 = exr_get_storage(0,partidx,&storage);
    if (iVar2 != 2) goto LAB_00139a32;
    uVar1 = exr_get_storage(outf,partidx + -1,&storage);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_00139ad2;
    uVar1 = exr_get_storage(outf,partidx + 1,&storage);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_00139b72;
    uVar1 = exr_get_storage(outf,partidx,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_00139c12;
    uVar1 = exr_get_storage(outf,partidx,&storage);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139cb2;
    iVar2 = 0;
    if (storage != EXR_STORAGE_TILED) goto LAB_00139d13;
    iVar2 = exr_set_longname_support(0,0);
    if (iVar2 != 2) goto LAB_00139d2b;
    uVar1 = exr_set_longname_support(outf,1);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139dcb;
    func = (exr_chunk_info_t *)0x2a;
    uVar1 = exr_attr_set_int(outf,partidx,"shortname");
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139e2c;
    uVar1 = exr_set_longname_support(outf,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139e8d;
    uVar1 = exr_set_longname_support(outf,1);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139eee;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"reallongreallongreallonglongchannelname",1,0,1,1);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_00139f4f;
    iVar2 = exr_set_longname_support(outf,0);
    if (iVar2 != 0xc) goto LAB_00139fb0;
    uVar1 = exr_finish(&outf);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a050;
    remove(outfn._M_dataplus._M_p);
    func = (exr_chunk_info_t *)local_c0;
    uVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a0b1;
    func = (exr_chunk_info_t *)&partidx;
    uVar1 = exr_add_part(outf,"beauty",1);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a112;
    func = (exr_chunk_info_t *)0x2a;
    iVar2 = exr_attr_set_int(outf,partidx,"areallongreallongreallonglongname");
    if (iVar2 != 0xc) goto LAB_0013a173;
    uVar1 = exr_set_longname_support(outf,1);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a213;
    func = (exr_chunk_info_t *)0x2a;
    uVar1 = exr_attr_set_int(outf,partidx,"areallongreallongreallonglongname");
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a274;
    iVar2 = exr_set_longname_support(outf,0);
    if (iVar2 != 0xc) goto LAB_0013a2d5;
    uVar1 = exr_get_zip_compression_level(0,1,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 2) goto LAB_0013a375;
    uVar1 = exr_get_zip_compression_level(outf,0xffffffffffffffff,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013a415;
    uVar1 = exr_get_zip_compression_level(outf,5,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013a4b5;
    uVar1 = exr_get_zip_compression_level(outf,0,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013a555;
    zlev = -2;
    uVar1 = exr_get_zip_compression_level(outf,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a5f5;
    iVar2 = 0;
    if (zlev != -1) goto LAB_0013a656;
    iVar2 = exr_set_zip_compression_level(0,0,5);
    if (iVar2 != 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(2);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (__null, 0, 5)",(char *)0x189,0x320d59,
                     (char *)func);
LAB_0013a707:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (outf, -1, 5)",(char *)0x18c,0x320d59,
                     (char *)func);
LAB_0013a7a7:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (outf, 5, 5)",(char *)0x18f,0x320d59,
                     (char *)func);
LAB_0013a847:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (outf, 0, -2)",(char *)0x191,0x320d59,
                     (char *)func);
LAB_0013a8e7:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (outf, 0, 42)",(char *)0x193,0x320d59,
                     (char *)func);
LAB_0013a987:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar4 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_zip_compression_level (outf, 0, 4)",(char *)0x194,0x320d59,
                     (char *)func);
LAB_0013a9e8:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      iVar2 = (int)poVar5;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_zip_compression_level (outf, 0, &zlev)",(char *)0x195,0x320d59,
                     (char *)func);
LAB_0013aa49:
      pcVar7 = (char *)0x196;
      pcVar6 = "zlev == 4";
      goto LAB_0013aa55;
    }
    uVar1 = exr_set_zip_compression_level(outf,0xffffffffffffffff,5);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013a707;
    uVar1 = exr_set_zip_compression_level(outf,5);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013a7a7;
    uVar1 = exr_set_zip_compression_level(outf,0,0xfffffffffffffffe);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013a847;
    uVar1 = exr_set_zip_compression_level(outf,0,0x2a);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013a8e7;
    uVar1 = exr_set_zip_compression_level(outf,0,4);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a987;
    uVar1 = exr_get_zip_compression_level(outf,0,&zlev);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013a9e8;
    iVar2 = 0;
    if (zlev != 4) goto LAB_0013aa49;
    iVar2 = exr_get_dwa_compression_level(0,0,0);
    if (iVar2 != 2) goto LAB_0013aa61;
    uVar1 = exr_get_dwa_compression_level(outf,0xffffffffffffffff,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013ab01;
    uVar1 = exr_get_dwa_compression_level(outf,5,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013aba1;
    uVar1 = exr_get_dwa_compression_level(outf,0,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013ac41;
    dlev = -3.0;
    uVar1 = exr_get_dwa_compression_level(outf,0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013ace1;
    if ((dlev != 45.0) || (NAN(dlev))) goto LAB_0013ad42;
    iVar2 = exr_set_dwa_compression_level(0x40a00000,0,0);
    if (iVar2 != 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(2);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_dwa_compression_level (__null, 0, 5)",(char *)0x1aa,0x320d59,
                     (char *)func);
LAB_0013adf3:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_dwa_compression_level (outf, -1, 5)",(char *)0x1ad,0x320d59,
                     (char *)func);
LAB_0013ae93:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_dwa_compression_level (outf, 5, 5)",(char *)0x1b0,0x320d59,
                     (char *)func);
LAB_0013af33:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_dwa_compression_level (outf, 0, -2.f)",(char *)0x1b3,0x320d59,
                     (char *)func);
LAB_0013afd3:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar4 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_set_dwa_compression_level (outf, 0, (__builtin_inff ()))",(char *)0x1b6,
                     0x320d59,(char *)func);
LAB_0013b073:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
      poVar5 = std::operator<<(poVar4,pcVar7);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar4 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(3);
      poVar5 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_set_dwa_compression_level (outf, 0, (__builtin_nanf (\"\")))",
                     (char *)0x1b9,0x320d59,(char *)func);
LAB_0013b113:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_set_dwa_compression_level (outf, 0, 42.f)",(char *)0x1ba,0x320d59,
                     (char *)func);
LAB_0013b174:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_dwa_compression_level (outf, 0, &dlev)",(char *)0x1bb,0x320d59,
                     (char *)func);
LAB_0013b1d5:
      pcVar7 = (char *)0x1bc;
      pcVar6 = "dlev == 42.f";
      goto LAB_0013b2b4;
    }
    uVar1 = exr_set_dwa_compression_level(0x40a00000,outf,0xffffffffffffffff);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013adf3;
    uVar1 = exr_set_dwa_compression_level(0x40a00000,outf,5);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013ae93;
    uVar1 = exr_set_dwa_compression_level(0xc0000000,outf,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013af33;
    uVar1 = exr_set_dwa_compression_level(0x7f800000,outf,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013afd3;
    uVar1 = exr_set_dwa_compression_level(0x7fc00000,outf,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 3) goto LAB_0013b073;
    uVar1 = exr_set_dwa_compression_level(0x42280000,outf,0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b113;
    uVar1 = exr_get_dwa_compression_level(outf,0,&dlev);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b174;
    if ((dlev != 42.0) || (NAN(dlev))) goto LAB_0013b1d5;
    uVar1 = exr_set_dwa_compression_level(0x43d20000,outf,0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(uVar1);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_set_dwa_compression_level (outf, 0, 420.f)",(char *)0x1bd,0x320d59,
                     (char *)func);
LAB_0013b247:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar7 = (char *)exr_get_default_error_message(poVar4);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_get_dwa_compression_level (outf, 0, &dlev)",(char *)0x1be,0x320d59,
                     (char *)func);
LAB_0013b2a8:
      pcVar7 = (char *)0x1bf;
      pcVar6 = "dlev == 420.f";
      goto LAB_0013b2b4;
    }
    uVar1 = exr_get_dwa_compression_level(outf,0,&dlev);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b247;
    if ((dlev != 420.0) || (NAN(dlev))) goto LAB_0013b2a8;
    uVar1 = exr_finish(&outf);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b2c0;
    remove(outfn._M_dataplus._M_p);
    func = (exr_chunk_info_t *)local_c0;
    uVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b321;
    func = (exr_chunk_info_t *)&partidx;
    uVar1 = exr_add_part(outf,"beauty",0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b382;
    dataw.min.x = -2;
    dataw.min.y = -3;
    dataw.max.x = 0x202;
    dataw.max.y = 0x203;
    func = (exr_chunk_info_t *)&dispw;
    dispw.min.x = 0;
    dispw.min.y = 0;
    dispw.max.x = 0x200;
    dispw.max.y = 0x200;
    swc.x = 0.5;
    swc.y = 0.5;
    uVar1 = exr_initialize_required_attr(0x3f800000,0x3f800000,outf,partidx);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b3e3;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"R",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b444;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"G",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b4a5;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"B",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b506;
    uVar1 = exr_write_header(outf);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b567;
    uVar1 = exr_get_file_version_and_flags(outf,&verflags);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b5c8;
    if (verflags != 2) goto LAB_0013b629;
    uVar1 = exr_get_chunk_table_offset(outf,0,&cto);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b641;
    if (cto != 0x16c) goto LAB_0013b6a2;
    uVar1 = exr_finish(&outf);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b6ba;
    remove(outfn._M_dataplus._M_p);
    func = (exr_chunk_info_t *)local_c0;
    uVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b71b;
    func = (exr_chunk_info_t *)&partidx;
    uVar1 = exr_add_part(outf,"beauty",1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b77c;
    dataw.min.x = 0;
    dataw.min.y = 0;
    dataw.max.x = 0x200;
    dataw.max.y = 0x200;
    func = (exr_chunk_info_t *)&dispw;
    uVar1 = exr_initialize_required_attr(0x3f800000,0x3f800000,outf,partidx,&dataw,func,&swc,0,2);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b7dd;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"R",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b83e;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"G",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b89f;
    func = (exr_chunk_info_t *)0x1;
    uVar1 = exr_add_channel(outf,partidx,"B",1,0,1,1);
    poVar4 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013b900;
    iVar2 = exr_write_header(outf);
    if (iVar2 != 0xd) goto LAB_0013b961;
    func = (exr_chunk_info_t *)0x20;
    uVar1 = exr_set_tile_descriptor(outf,partidx,0x20,0x20,0,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013ba01;
    func = (exr_chunk_info_t *)&tysize;
    iVar2 = exr_get_tile_descriptor(0,partidx,&txsize,func,&lmode,&rmode);
    if (iVar2 != 2) goto LAB_0013ba62;
    func = (exr_chunk_info_t *)&tysize;
    uVar1 = exr_get_tile_descriptor(outf,0xffffffffffffffff,&txsize,func,&lmode,&rmode);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013bb02;
    func = (exr_chunk_info_t *)&tysize;
    uVar1 = exr_get_tile_descriptor(outf,partidx + 10,&txsize,func,&lmode,&rmode);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 4) goto LAB_0013bba2;
    func = (exr_chunk_info_t *)&tysize;
    uVar1 = exr_get_tile_descriptor(outf,partidx,&txsize,func,&lmode,&rmode);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013bc42;
    pcVar7 = (char *)0x239;
    pcVar6 = "txsize == 32 && tysize == 32";
    if ((txsize != 0x20) || (tysize != 0x20)) goto LAB_0013bd71;
    uVar1 = exr_write_header(outf);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013bca3;
    uVar1 = exr_get_file_version_and_flags(outf,&verflags);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013bd04;
    if (verflags != 0x202) goto LAB_0013bd65;
    uVar1 = exr_finish(&outf);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013bd7d;
    remove(outfn._M_dataplus._M_p);
    func = (exr_chunk_info_t *)local_c0;
    uVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
    poVar5 = (ostream *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0013bdde;
    iVar2 = exr_write_header(outf);
    if (iVar2 == 6) {
      uVar1 = exr_finish(&outf);
      poVar5 = (ostream *)(ulong)uVar1;
      if (uVar1 == 0) {
        remove(outfn._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&outfn);
        return;
      }
      goto LAB_0013bedf;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(uVar1);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x120,0x320d59,(char *)func);
LAB_0013936a:
    pcVar6 = (char *)(ulong)uVar1;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(pcVar6);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_count (outf, &partidx)",(char *)0x122,0x320d59,(char *)func);
LAB_001393cb:
    pcVar7 = (char *)0x123;
LAB_0013968a:
    core_test_fail(pcVar6,pcVar7,0x320d59,(char *)func);
LAB_00139699:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)pcVar6);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)pcVar6 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,7);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(7);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (outf, partidx, 42, &cinfo)",(char *)0x136,0x320d59
                   ,(char *)func);
LAB_00139739:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_name (__null, partidx, &partname)",(char *)0x13a,0x320d59,(char *)func);
LAB_001397d9:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_name (outf, partidx - 1, &partname)",(char *)0x13d,0x320d59,(char *)func
                  );
LAB_00139879:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_name (outf, partidx + 1, &partname)",(char *)0x140,0x320d59,(char *)func
                  );
LAB_00139919:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_name (outf, partidx, __null)",(char *)0x142,0x320d59,(char *)func);
LAB_001399b9:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_name (outf, partidx, &partname)",(char *)0x143,0x320d59,(char *)func);
LAB_00139a1a:
    core_test_fail("0 == strcmp (partname, \"beauty\")",(char *)0x144,0x320d59,(char *)func);
LAB_00139a32:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_storage (__null, partidx, &storage)",(char *)0x148,0x320d59,(char *)func
                  );
LAB_00139ad2:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_storage (outf, partidx - 1, &storage)",(char *)0x14b,0x320d59,
                   (char *)func);
LAB_00139b72:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_storage (outf, partidx + 1, &storage)",(char *)0x14e,0x320d59,
                   (char *)func);
LAB_00139c12:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_storage (outf, partidx, __null)",(char *)0x150,0x320d59,(char *)func);
LAB_00139cb2:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_storage (outf, partidx, &storage)",(char *)0x151,0x320d59,(char *)func);
LAB_00139d13:
    core_test_fail("storage == EXR_STORAGE_TILED",(char *)0x152,0x320d59,(char *)func);
LAB_00139d2b:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (__null, 0)",(char *)0x155,0x320d59,(char *)func);
LAB_00139dcb:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 1)",(char *)0x156,0x320d59,(char *)func);
LAB_00139e2c:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_set_int (outf, partidx, \"shortname\", 42)",(char *)0x157,0x320d59,
                   (char *)func);
LAB_00139e8d:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 0)",(char *)0x158,0x320d59,(char *)func);
LAB_00139eee:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 1)",(char *)0x159,0x320d59,(char *)func);
LAB_00139f4f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"reallongreallongreallonglongchannelname\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x161,0x320d59,(char *)func);
LAB_00139fb0:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(0xc);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 0)",(char *)0x163,0x320d59,(char *)func);
LAB_0013a050:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_finish (&outf)",(char *)0x164,0x320d59,(char *)func);
LAB_0013a0b1:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x168,0x320d59,(char *)func);
LAB_0013a112:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x16a,
                   0x320d59,(char *)func);
LAB_0013a173:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(0xc);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_set_int ( outf, partidx, \"areallongreallongreallonglongname\", 42)",
                   (char *)0x16f,0x320d59,(char *)func);
LAB_0013a213:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 1)",(char *)0x171,0x320d59,(char *)func);
LAB_0013a274:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_attr_set_int ( outf, partidx, \"areallongreallongreallonglongname\", 42)",
                   (char *)0x173,0x320d59,(char *)func);
LAB_0013a2d5:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(0xc);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_set_longname_support (outf, 0)",(char *)0x175,0x320d59,(char *)func);
LAB_0013a375:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_zip_compression_level (__null, 1, __null)",(char *)0x179,0x320d59,
                   (char *)func);
LAB_0013a415:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_zip_compression_level (outf, -1, __null)",(char *)0x17c,0x320d59,
                   (char *)func);
LAB_0013a4b5:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_zip_compression_level (outf, 5, __null)",(char *)0x17f,0x320d59,
                   (char *)func);
LAB_0013a555:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_zip_compression_level (outf, 0, __null)",(char *)0x182,0x320d59,
                   (char *)func);
LAB_0013a5f5:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_zip_compression_level (outf, 0, &zlev)",(char *)0x184,0x320d59,
                   (char *)func);
LAB_0013a656:
    pcVar7 = (char *)0x185;
    pcVar6 = "zlev == -1";
LAB_0013aa55:
    core_test_fail(pcVar6,pcVar7,0x320d59,(char *)func);
LAB_0013aa61:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_dwa_compression_level (__null, 0, __null)",(char *)0x19a,0x320d59,
                   (char *)func);
LAB_0013ab01:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_dwa_compression_level (outf, -1, __null)",(char *)0x19d,0x320d59,
                   (char *)func);
LAB_0013aba1:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_dwa_compression_level (outf, 5, __null)",(char *)0x1a0,0x320d59,
                   (char *)func);
LAB_0013ac41:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar4 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_dwa_compression_level (outf, 0, __null)",(char *)0x1a3,0x320d59,
                   (char *)func);
LAB_0013ace1:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_dwa_compression_level (outf, 0, &dlev)",(char *)0x1a5,0x320d59,
                   (char *)func);
LAB_0013ad42:
    pcVar7 = (char *)0x1a6;
    pcVar6 = "dlev == 45.f";
LAB_0013b2b4:
    core_test_fail(pcVar6,pcVar7,0x320d59,(char *)func);
LAB_0013b2c0:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_finish (&outf)",(char *)0x1c1,0x320d59,(char *)func);
LAB_0013b321:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x1c5,0x320d59,(char *)func);
LAB_0013b382:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_SCANLINE, &partidx)",(char *)0x1c7,
                   0x320d59,(char *)func);
LAB_0013b3e3:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_initialize_required_attr ( outf, partidx, &dataw, &dispw, 1.f, &swc, 1.f, EXR_LINEORDER_INCREASING_Y, EXR_COMPRESSION_ZIPS)"
                   ,(char *)0x1d4,0x320d59,(char *)func);
LAB_0013b444:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"R\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x1dc,0x320d59,(char *)func);
LAB_0013b4a5:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"G\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x1e4,0x320d59,(char *)func);
LAB_0013b506:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"B\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x1ec,0x320d59,(char *)func);
LAB_0013b567:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_write_header (outf)",(char *)0x1ee,0x320d59,(char *)func);
LAB_0013b5c8:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_file_version_and_flags (outf, &verflags)",(char *)0x1f0,0x320d59,
                   (char *)func);
LAB_0013b629:
    core_test_fail("verflags == 2",(char *)0x1f1,0x320d59,(char *)func);
LAB_0013b641:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_chunk_table_offset (outf, 0, &cto)",(char *)0x1f5,0x320d59,(char *)func)
    ;
LAB_0013b6a2:
    core_test_fail("cto == 364",(char *)0x1f6,0x320d59,(char *)func);
LAB_0013b6ba:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_finish (&outf)",(char *)0x1f8,0x320d59,(char *)func);
LAB_0013b71b:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x1fe,0x320d59,(char *)func);
LAB_0013b77c:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x200,
                   0x320d59,(char *)func);
LAB_0013b7dd:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_initialize_required_attr ( outf, partidx, &dataw, &dispw, 1.f, &swc, 1.f, EXR_LINEORDER_INCREASING_Y, EXR_COMPRESSION_ZIPS)"
                   ,(char *)0x20b,0x320d59,(char *)func);
LAB_0013b83e:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"R\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x213,0x320d59,(char *)func);
LAB_0013b89f:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)poVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"G\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x21b,0x320d59,(char *)func);
LAB_0013b900:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar4;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_add_channel ( outf, partidx, \"B\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x223,0x320d59,(char *)func);
LAB_0013b961:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(0xd);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_write_header (outf)",(char *)0x225,0x320d59,(char *)func);
LAB_0013ba01:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_set_tile_descriptor ( outf, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_DOWN)"
                   ,(char *)0x227,0x320d59,(char *)func);
LAB_0013ba62:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_tile_descriptor ( __null, partidx, &txsize, &tysize, &lmode, &rmode)",
                   (char *)0x22f,0x320d59,(char *)func);
LAB_0013bb02:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_tile_descriptor (outf, -1, &txsize, &tysize, &lmode, &rmode)",
                   (char *)0x232,0x320d59,(char *)func);
LAB_0013bba2:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_tile_descriptor ( outf, partidx + 10, &txsize, &tysize, &lmode, &rmode)"
                   ,(char *)0x236,0x320d59,(char *)func);
LAB_0013bc42:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_tile_descriptor ( outf, partidx, &txsize, &tysize, &lmode, &rmode)",
                   (char *)0x238,0x320d59,(char *)func);
LAB_0013bca3:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_write_header (outf)",(char *)0x23b,0x320d59,(char *)func);
LAB_0013bd04:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_file_version_and_flags (outf, &verflags)",(char *)0x23d,0x320d59,
                   (char *)func);
LAB_0013bd65:
    pcVar7 = (char *)0x23e;
    pcVar6 = "verflags == (2 | 0x00000200)";
LAB_0013bd71:
    core_test_fail(pcVar6,pcVar7,0x320d59,(char *)func);
LAB_0013bd7d:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_finish (&outf)",(char *)0x240,0x320d59,(char *)func);
LAB_0013bdde:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x246,0x320d59,(char *)func);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar7 = (char *)exr_get_default_error_message(iVar2);
  poVar5 = std::operator<<(poVar5,pcVar7);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,6);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar7 = (char *)exr_get_default_error_message(6);
  poVar4 = std::operator<<(poVar5,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar4);
  core_test_fail("exr_write_header (outf)",(char *)0x247,0x320d59,(char *)func);
LAB_0013bedf:
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar7 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar4,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_finish (&outf)",(char *)0x248,0x320d59,(char *)func);
  std::__cxx11::string::~string((string *)&outfn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testWriteBaseHeader (const std::string& tempdir)
{
    exr_context_t outf;
    std::string   outfn = tempdir + "testattr.exr";
    int           partidx;
    uint32_t      verflags;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));

    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_count (NULL, &partidx));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_count (outf, NULL));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_add_part (NULL, "beauty", EXR_STORAGE_TILED, &partidx));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_READ,
        exr_read_scanline_chunk_info (outf, partidx, 42, &cinfo));

    const char* partname;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_name (NULL, partidx, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_name (outf, partidx - 1, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_name (outf, partidx + 1, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_name (outf, partidx, NULL));
    EXRCORE_TEST_RVAL (exr_get_name (outf, partidx, &partname));
    EXRCORE_TEST (0 == strcmp (partname, "beauty"));

    exr_storage_t storage;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_storage (NULL, partidx, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_storage (outf, partidx - 1, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_storage (outf, partidx + 1, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_storage (outf, partidx, NULL));
    EXRCORE_TEST_RVAL (exr_get_storage (outf, partidx, &storage));
    EXRCORE_TEST (storage == EXR_STORAGE_TILED);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_set_longname_support (NULL, 0));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_attr_set_int (outf, partidx, "shortname", 42));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 0));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "reallongreallongreallonglongchannelname",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG, exr_set_longname_support (outf, 0));
    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_set_int (
            outf, partidx, "areallongreallongreallonglongname", 42));

    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_attr_set_int (
        outf, partidx, "areallongreallongreallonglongname", 42));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG, exr_set_longname_support (outf, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_zip_compression_level (NULL, 1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_zip_compression_level (outf, -1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_zip_compression_level (outf, 5, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_get_zip_compression_level (outf, 0, NULL));
    int zlev = -2;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (outf, 0, &zlev));
    EXRCORE_TEST (zlev == -1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_set_zip_compression_level (NULL, 0, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_zip_compression_level (outf, -1, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_zip_compression_level (outf, 5, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_set_zip_compression_level (outf, 0, -2));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_set_zip_compression_level (outf, 0, 42));
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (outf, 0, 4));
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (outf, 0, &zlev));
    EXRCORE_TEST (zlev == 4);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_dwa_compression_level (NULL, 0, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_dwa_compression_level (outf, -1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_dwa_compression_level (outf, 5, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_get_dwa_compression_level (outf, 0, NULL));
    float dlev = -3.f;
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 45.f);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_set_dwa_compression_level (NULL, 0, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_dwa_compression_level (outf, -1, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_dwa_compression_level (outf, 5, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, -2.f));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, INFINITY));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, NAN));
    EXRCORE_TEST_RVAL (exr_set_dwa_compression_level (outf, 0, 42.f));
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 42.f);
    EXRCORE_TEST_RVAL (exr_set_dwa_compression_level (outf, 0, 420.f));
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 420.f);

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_SCANLINE, &partidx));
    exr_attr_box2i_t dataw = {{-2, -3}, {514, 515}};
    exr_attr_box2i_t dispw = {{0, 0}, {512, 512}};
    exr_attr_v2f_t   swc   = {0.5f, 0.5f};
    EXRCORE_TEST_RVAL (exr_initialize_required_attr (
        outf,
        partidx,
        &dataw,
        &dispw,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        EXR_COMPRESSION_ZIPS));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "R",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "G",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "B",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));

    EXRCORE_TEST_RVAL (exr_write_header (outf));
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == 2);

    uint64_t cto;
    EXRCORE_TEST_RVAL (
        exr_get_chunk_table_offset (outf, 0, &cto));
    EXRCORE_TEST (cto == 364);

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    ////

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));
    dataw = {{0, 0}, {512, 512}};
    EXRCORE_TEST_RVAL (exr_initialize_required_attr (
        outf,
        partidx,
        &dataw,
        &dispw,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        EXR_COMPRESSION_ZIPS));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "R",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "G",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "B",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));

    EXRCORE_TEST_RVAL_FAIL (EXR_ERR_MISSING_REQ_ATTR, exr_write_header (outf));
    EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
        outf, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_DOWN));

    uint32_t              txsize, tysize;
    exr_tile_level_mode_t lmode;
    exr_tile_round_mode_t rmode;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_descriptor (
            NULL, partidx, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_descriptor (outf, -1, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_descriptor (
            outf, partidx + 10, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL (exr_get_tile_descriptor (
        outf, partidx, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST (txsize == 32 && tysize == 32);

    EXRCORE_TEST_RVAL (exr_write_header (outf));
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == (2 | 0x00000200));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    ////

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL_FAIL (EXR_ERR_FILE_BAD_HEADER, exr_write_header (outf));
    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());
}